

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O1

CallResultWrap * tapi_cancel_order1(void *h,char *account_id,char *code,char *entrust_no)

{
  CallResultWrap *pCVar1;
  CallResult<bool> r;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string((string *)local_38,account_id,&local_a9);
    std::__cxx11::string::string((string *)local_58,code,&local_aa);
    std::__cxx11::string::string((string *)local_78,entrust_no,&local_ab);
    (**(code **)(*h + 0x60))(&local_a8,h,local_38,local_58,local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    pCVar1 = (CallResultWrap *)operator_new(0x10c);
    *(undefined8 *)((long)&pCVar1->value + 4) = 0;
    pCVar1->element_count = 0;
    pCVar1->value_type = 0;
    pCVar1->msg = (char *)0x0;
    pCVar1->value = (void *)0x0;
    (pCVar1->_msg)._M_dataplus._M_p = (pointer)&(pCVar1->_msg).field_2;
    (pCVar1->_msg)._M_string_length = 0;
    (pCVar1->_msg).field_2._M_local_buf[0] = '\0';
    (pCVar1->text)._M_dataplus._M_p = (pointer)&(pCVar1->text).field_2;
    (pCVar1->text)._M_string_length = 0;
    (pCVar1->text).field_2._M_local_buf[0] = '\0';
    memset(&pCVar1->bars,0,0xb0);
    if (local_a8 == (element_type *)0x0) {
      utf8_to_utf16(&local_98,&pCVar1->_msg);
      pCVar1->msg = (pCVar1->_msg)._M_dataplus._M_p;
    }
    else {
      (pCVar1->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pCVar1->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_a0);
      pCVar1->value =
           (pCVar1->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar1->element_size = 1;
      pCVar1->element_count = 1;
      pCVar1->value_type = 0xb;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
    }
    return pCVar1;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x18a,
                "CallResultWrap *tapi_cancel_order1(void *, const char *, const char *, const char *)"
               );
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_cancel_order1(void* h, const char* account_id,
                                   const char* code,
                                   const char* entrust_no)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->cancel_order(account_id, code, entrust_no);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
        cr->bool_value = r.value;
        cr->value = reinterpret_cast<const void*>(cr->bool_value.get());
        cr->element_size = sizeof(bool);
        cr->element_count = 1;
        cr->value_type = VT_BOOL;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}